

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O3

void __thiscall
sai::ifstreambuf::ifstreambuf(ifstreambuf *this,span<const_unsigned_int,_256UL> DecryptionKey)

{
  VirtualPage *pVVar1;
  
  *(code **)this = std::ostream::flush;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__ifstreambuf_00109d10;
  std::ifstream::ifstream(&this->FileIn);
  (this->Key)._M_ptr = DecryptionKey._M_ptr;
  this->CurrentPage = 0xffffffff;
  (this->PageCache)._M_t.
  super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
  super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
  super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl = (VirtualPage *)0x0;
  this->PageCacheIndex = 0xffffffff;
  (this->TableCache)._M_t.
  super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
  super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
  super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl = (VirtualPage *)0x0;
  this->TableCacheIndex = 0xffffffff;
  this->PageCount = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  pVVar1 = (VirtualPage *)operator_new(0x1000);
  memset(pVVar1,0,0x1000);
  (this->PageCache)._M_t.
  super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
  super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
  super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl = pVVar1;
  pVVar1 = (VirtualPage *)operator_new(0x1000);
  memset(pVVar1,0,0x1000);
  (this->TableCache)._M_t.
  super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
  super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
  super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl = pVVar1;
  return;
}

Assistant:

ifstreambuf::ifstreambuf(std::span<const std::uint32_t, 256> DecryptionKey) : Key(DecryptionKey)
{
	setg(nullptr, nullptr, nullptr);
	setp(nullptr, nullptr);

	PageCache  = std::make_unique<VirtualPage>();
	TableCache = std::make_unique<VirtualPage>();
}